

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall
cmListFileParser::AddArgument(cmListFileParser *this,cmListFileLexer_Token *token,Delimiter delim)

{
  int iVar1;
  cmMakefile *this_00;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  string sStack_1f8;
  cmListFileArgument a;
  ostringstream m;
  
  std::__cxx11::string::string((string *)&m,token->text,(allocator *)&sStack_1f8);
  iVar1 = token->line;
  std::__cxx11::string::string((string *)&a,(string *)&m);
  a.Delim = delim;
  a.Line = (long)iVar1;
  std::__cxx11::string::~string((string *)&m);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
            (&(this->Function).Arguments,&a);
  if (this->Separation == SeparationOkay) {
    bVar2 = true;
  }
  else {
    bVar5 = this->Separation != SeparationError;
    bVar6 = delim != Bracket;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&m);
    poVar3 = std::operator<<((ostream *)&m,"Syntax ");
    bVar2 = bVar6 && bVar5;
    pcVar4 = "Error";
    if (bVar6 && bVar5) {
      pcVar4 = "Warning";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," in cmake code at\n");
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = std::operator<<(poVar3,this->FileName);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,token->line);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,token->column);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"Argument not separated from preceding token by whitespace.");
    this_00 = this->Makefile;
    if (bVar6 && bVar5) {
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&sStack_1f8,false);
    }
    else {
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&sStack_1f8,false);
    }
    std::__cxx11::string::~string((string *)&sStack_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m);
  }
  std::__cxx11::string::~string((string *)&a);
  return bVar2;
}

Assistant:

bool cmListFileParser::AddArgument(cmListFileLexer_Token* token,
                                   cmListFileArgument::Delimiter delim)
{
  cmListFileArgument a(token->text, delim, token->line);
  this->Function.Arguments.push_back(a);
  if(this->Separation == SeparationOkay)
    {
    return true;
    }
  bool isError = (this->Separation == SeparationError ||
                  delim == cmListFileArgument::Bracket);
  std::ostringstream m;
  m << "Syntax " << (isError? "Error":"Warning") << " in cmake code at\n"
    << "  " << this->FileName << ":" << token->line << ":"
    << token->column << "\n"
    << "Argument not separated from preceding token by whitespace.";
  if(isError)
    {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, m.str());
    return false;
    }
  else
    {
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, m.str());
    return true;
    }
}